

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence::~IfcAnnotationFillAreaOccurrence
          (IfcAnnotationFillAreaOccurrence *this)

{
  void *pvVar1;
  
  *(undefined8 *)&this[-1].field_0x60 = 0x8b5de8;
  *(undefined8 *)&this->field_0x48 = 0x8b5e88;
  *(undefined8 *)&this[-1].field_0x70 = 0x8b5e10;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8b5e38;
  *(undefined8 *)this = 0x8b5e60;
  if (*(undefined1 **)&this->field_0x20 != &this->field_0x30) {
    operator_delete(*(undefined1 **)&this->field_0x20);
  }
  *(undefined8 *)&this[-1].field_0x60 = 0x8b6000;
  *(undefined8 *)&this->field_0x48 = 0x8b6050;
  *(undefined8 *)&this[-1].field_0x70 = 0x8b6028;
  if (*(undefined1 **)&this[-1].field_0xa8 != &this[-1].field_0xb8) {
    operator_delete(*(undefined1 **)&this[-1].field_0xa8);
  }
  pvVar1 = *(void **)&this[-1].
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationFillAreaOccurrence,_2UL>
                      .field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1);
  }
  operator_delete(&this[-1].field_0x60);
  return;
}

Assistant:

IfcAnnotationFillAreaOccurrence() : Object("IfcAnnotationFillAreaOccurrence") {}